

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

int find_package_from_name(char *packname,int len)

{
  DLword *pDVar1;
  LispPTR LVar2;
  int index;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)*Package_from_Index_word;
  if ((*Package_from_Index_word & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar4);
  }
  pDVar1 = Lisp_world;
  if (1 < *(int *)(Lisp_world + uVar4 + 4)) {
    index = 1;
    do {
      LVar2 = aref1(*Package_from_Index_word,index);
      if ((LVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar2);
      }
      uVar3 = (ulong)*(uint *)(Lisp_world + (ulong)LVar2 + 4);
      if ((*(uint *)(Lisp_world + (ulong)LVar2 + 4) & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar3);
      }
      if (((uint)Lisp_world[uVar3 + 4] == len) &&
         (LVar2 = compare_chars((char *)((long)Lisp_world +
                                        (ulong)Lisp_world[uVar3 + 2] +
                                        (ulong)(*(uint *)(Lisp_world + uVar3) & 0xfffffff) * 2),
                                packname,(DLword)len), LVar2 == 1)) {
        return index;
      }
      index = index + 1;
    } while (index < *(int *)(pDVar1 + uVar4 + 4));
  }
  return -1;
}

Assistant:

int find_package_from_name(const char *packname, int len) {
  int index;
  PACKAGE *package;
  NEWSTRINGP *namestring;
  DLword len2;
  char *pname;
  struct arrayheader *pi_array;

  /* assumes the *PACKAGE-FROM-INDEX* array is simple with no offset */
  pi_array = (struct arrayheader *)NativeAligned4FromLAddr(*Package_from_Index_word);
  for (index = 1; index < pi_array->totalsize; index++) {
    package = (PACKAGE *)NativeAligned4FromLAddr(aref1(*Package_from_Index_word, index));
    namestring = (NEWSTRINGP *)NativeAligned4FromLAddr(package->NAME);
    pname = (char *)NativeAligned2FromLAddr(namestring->base);
    if (namestring->offset != 0) { pname += namestring->offset; }

    len2 = (DLword)(namestring->fillpointer);
    if (len == len2) {
      if (compare_chars(pname, packname, len) == T) { return (index); }
    }
  } /* for end */
  return (-1);
}